

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build.cpp
# Opt level: O2

void Omega_h::build_from_elems2verts
               (Mesh *mesh,CommPtr *comm,Omega_h_Family family,Int edim,LOs *ev2v,
               Read<long> *vert_globals)

{
  Write<int> WStack_68;
  Write<int> local_58;
  Write<long> local_48;
  Write<int> local_38;
  
  Mesh::set_comm(mesh,comm);
  Mesh::set_parting(mesh,OMEGA_H_ELEM_BASED,false);
  Mesh::set_family(mesh,family);
  Mesh::set_dim(mesh,edim);
  Write<long>::Write(&local_38,(Write<int> *)vert_globals);
  build_verts_from_globals(mesh,(GOs *)&local_38);
  Write<long>::~Write((Write<long> *)&local_38);
  Write<int>::Write(&local_58,&ev2v->write_);
  Write<long>::Write(&WStack_68,(Write<int> *)vert_globals);
  local_48.shared_alloc_.alloc = (Alloc *)0x0;
  local_48.shared_alloc_.direct_ptr = (void *)0x0;
  build_ents_from_elems2verts(mesh,(LOs *)&local_58,(GOs *)&WStack_68,(GOs *)&local_48);
  Write<long>::~Write(&local_48);
  Write<long>::~Write((Write<long> *)&WStack_68);
  Write<int>::~Write(&local_58);
  return;
}

Assistant:

void build_from_elems2verts(Mesh* mesh, CommPtr comm, Omega_h_Family family,
    Int edim, LOs ev2v, Read<GO> vert_globals) {
  mesh->set_comm(comm);
  mesh->set_parting(OMEGA_H_ELEM_BASED);
  mesh->set_family(family);
  mesh->set_dim(edim);
  build_verts_from_globals(mesh, vert_globals);
  build_ents_from_elems2verts(mesh, ev2v, vert_globals);
}